

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
DoSetProperty_NoFastPath<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout,Var instance,
          PropertyOperationFlags flags)

{
  byte bVar1;
  FunctionBody *this_00;
  InlineCache *this_01;
  Var value;
  bool bVar2;
  PropertyId PVar3;
  JavascriptCopyOnAccessNativeIntArray *this_02;
  undefined4 *puVar4;
  code *pcVar5;
  ConstructorCache *pCVar6;
  
  if (instance != (Var)0x0) {
    bVar2 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(instance);
    if (bVar2) {
      this_02 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(instance);
    }
    else {
      this_02 = (JavascriptCopyOnAccessNativeIntArray *)0x0;
    }
    if (this_02 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_02);
    }
  }
  bVar1 = playout->inlineCacheIndex;
  if (*(long *)(this + 0x90) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x378,"(this->inlineCaches != nullptr)",
                                "this->inlineCaches != nullptr");
    if (!bVar2) goto LAB_00a93fe4;
    *puVar4 = 0;
  }
  if (*(uint *)(this + 200) <= (uint)bVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x379,"(cacheIndex < this->inlineCacheCount)",
                                "cacheIndex < this->inlineCacheCount");
    if (!bVar2) {
LAB_00a93fe4:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar4 = 0;
  }
  this_00 = *(FunctionBody **)(this + 0x88);
  this_01 = *(InlineCache **)(*(long *)(this + 0x90) + (ulong)bVar1 * 8);
  if ((flags & PropertyOperation_Root) == PropertyOperation_None) {
    pcVar5 = JavascriptOperators::PatchPutValueNoLocalFastPath<false,Js::InlineCache>;
  }
  else {
    pcVar5 = JavascriptOperators::PatchPutRootValueNoLocalFastPath<false,Js::InlineCache>;
  }
  bVar1 = playout->inlineCacheIndex;
  PVar3 = FunctionBody::GetPropertyIdFromCacheId(this_00,(uint)bVar1);
  value = *(Var *)(this + (ulong)playout->Value * 8 + 0x160);
  ValidateRegValue(this,value,false,true);
  (*pcVar5)(this_00,this_01,bVar1,instance,PVar3,value,flags);
  bVar2 = VarIs<Js::RecyclableObject>(instance);
  if (bVar2) {
    pCVar6 = JavascriptFunction::GetConstructorCache(*(JavascriptFunction **)(this + 0x80));
    if ((pCVar6->content).updateAfterCtor == true) {
      InlineCache::RemoveFromInvalidationListAndClear
                (this_01,*(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8));
    }
  }
  return;
}

Assistant:

_NOINLINE void InterpreterStackFrame::DoSetProperty_NoFastPath(unaligned T* playout, Var instance, PropertyOperationFlags flags)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        InlineCache *const inlineCache = GetInlineCache(playout->inlineCacheIndex);

        const auto PatchPutRootValue = &JavascriptOperators::PatchPutRootValueNoLocalFastPath<false, InlineCache>;
        const auto PatchPutValue = &JavascriptOperators::PatchPutValueNoLocalFastPath<false, InlineCache>;
        const auto PatchPut = flags & PropertyOperation_Root ? PatchPutRootValue : PatchPutValue;
        PatchPut(
            GetFunctionBody(),
            inlineCache,
            playout->inlineCacheIndex,
            instance,
            GetPropertyIdFromCacheId(playout->inlineCacheIndex),
            GetReg(playout->Value),
            flags);

        if (!TaggedNumber::Is(instance) && GetJavascriptFunction()->GetConstructorCache()->NeedsUpdateAfterCtor())
        {
            // This function has only 'this' statements and is being used as a constructor. When the constructor exits, the
            // function object's constructor cache will be updated with the type produced by the constructor. From that
            // point on, when the same function object is used as a constructor, the a new object with the final type will
            // be created. Whatever is stored in the inline cache currently will cause cache misses after the constructor
            // cache update. So, just clear it now so that the caches won't be flagged as polymorphic.
            inlineCache->RemoveFromInvalidationListAndClear(this->GetScriptContext()->GetThreadContext());
        }
    }